

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::undoLast_abi_cxx11_(Station *this)

{
  double dVar1;
  double dVar2;
  value_type vVar3;
  bool bVar4;
  size_type sVar5;
  reference this_00;
  reference this_01;
  double *pdVar6;
  pointer ppVar7;
  reference pvVar8;
  long in_RSI;
  Collimator *in_RDI;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> pVar9;
  int i;
  iterator it;
  pair<int,_int> coord;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *undo_diff;
  pair<int,_int> *in_stack_fffffffffffffec8;
  pair<int,_int> *in_stack_fffffffffffffed0;
  value_type *in_stack_fffffffffffffed8;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_fffffffffffffee0;
  type in_stack_ffffffffffffff40;
  Collimator *this_02;
  int local_6c;
  pair<int,_int> local_48;
  _Self local_40;
  _Self local_38 [3];
  pair<int,_int> local_1c;
  undefined1 local_11;
  
  local_11 = 0;
  this_02 = in_RDI;
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x13cdc7);
  std::pair<int,_int>::pair<int,_int,_true>(&local_1c);
  sVar5 = std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                    ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     in_stack_fffffffffffffed0);
  if (sVar5 != 0) {
    if (-1 < *(int *)(in_RSI + 0x70)) {
      in_stack_ffffffffffffff40 = (type)(in_RSI + 0x78);
      this_00 = std::
                vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                              *)(in_RSI + 0x58),(long)*(int *)(in_RSI + 0x70));
      this_01 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                          (this_00,(long)*(int *)(in_RSI + 0x74));
      std::pair<int,_int>::operator=(this_01,in_stack_ffffffffffffff40);
    }
    local_38[0]._M_node =
         (_List_node_base *)
         std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                   ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                    in_stack_fffffffffffffec8);
    while( true ) {
      local_40._M_node =
           (_List_node_base *)
           std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::end
                     ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                      in_stack_fffffffffffffec8);
      bVar4 = std::operator!=(local_38,&local_40);
      if (!bVar4) break;
      std::_List_iterator<std::pair<int,_double>_>::operator->
                ((_List_iterator<std::pair<int,_double>_> *)0x13cefc);
      local_48 = Collimator::indexToPos
                           (this_02,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                            (int)in_stack_ffffffffffffff40);
      std::pair<int,_int>::operator=(&local_1c,&local_48);
      pdVar6 = maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),local_1c.first,local_1c.second);
      dVar1 = *pdVar6;
      ppVar7 = std::_List_iterator<std::pair<int,_double>_>::operator->
                         ((_List_iterator<std::pair<int,_double>_> *)0x13cf84);
      dVar2 = ppVar7->second;
      pdVar6 = maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),local_1c.first,local_1c.second);
      *pdVar6 = dVar1 - dVar2;
      std::_List_iterator<std::pair<int,_double>_>::operator->
                ((_List_iterator<std::pair<int,_double>_> *)0x13cfe3);
      std::_List_iterator<std::pair<int,_double>_>::operator->
                ((_List_iterator<std::pair<int,_double>_> *)0x13cff2);
      std::make_pair<int&,double>
                (&in_stack_fffffffffffffed0->first,(double *)in_stack_fffffffffffffec8);
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      push_back(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      std::_List_iterator<std::pair<int,_double>_>::operator++(local_38,0);
    }
    for (local_6c = 0; local_6c < *(int *)(in_RSI + 0x40); local_6c = local_6c + 1) {
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x98),(long)local_6c)
      ;
      vVar3 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)local_6c);
      *pvVar8 = vVar3;
    }
    std::make_pair<int,int>(&in_stack_fffffffffffffec8->first,(int *)0x13d121);
    std::make_pair<int,int>(&in_stack_fffffffffffffec8->first,(int *)0x13d160);
    pVar9 = std::make_pair<std::pair<int,int>,std::pair<int,int>>
                      (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    std::pair<std::pair<int,_int>,_std::pair<int,_int>_>::operator=
              ((pair<std::pair<int,_int>,_std::pair<int,_int>_> *)pVar9.first,(type)pVar9.second);
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::clear
              ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)pVar9.first
              );
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x13d1ee);
  }
  return (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)in_RDI;
}

Assistant:

list <pair<int,double> > Station::undoLast () {
    list <pair<int,double> > undo_diff;
    //if (last_mem.first.first<0) {
      //return(undo_diff);
    //}
    pair<int,int> coord;
    
    if (last_diff.size()< 1) return(undo_diff);

    if (last_mem.first.first>=0)
      A[last_mem.first.first][last_mem.first.second] = last_mem.second;

    for (list<pair<int,double> >::iterator it=last_diff.begin();it!=last_diff.end();it++) {
      coord=collimator.indexToPos(it->first, angle);
      I(coord.first,coord.second) = I(coord.first,coord.second) - (it->second);
      undo_diff.push_back(make_pair(it->first, -(it->second)));
    }
    
    for (int i=0;i<max_apertures;i++) {
      intensity[i]=last_intensity[i];
    }

    last_mem= make_pair(make_pair(-1,-1), make_pair(-1,-1));
    last_diff.clear();
    last_intensity.clear();

    return(undo_diff);
  }